

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDFloat32x4Operation::OpClamp(SIMDValue *value,SIMDValue *lower,SIMDValue *upper)

{
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar1;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  SIMDValue *upper_local;
  SIMDValue *lower_local;
  SIMDValue *value_local;
  SIMDValue result;
  
  if ((lower->field_0).f32[0] <= (value->field_0).f32[0]) {
    local_34 = (value->field_0).f32[0];
  }
  else {
    local_34 = (lower->field_0).f32[0];
  }
  if ((lower->field_0).f32[1] <= (value->field_0).f32[1]) {
    local_38 = (value->field_0).f32[1];
  }
  else {
    local_38 = (lower->field_0).f32[1];
  }
  if ((lower->field_0).f32[2] <= (value->field_0).f32[2]) {
    local_3c = (value->field_0).f32[2];
  }
  else {
    local_3c = (lower->field_0).f32[2];
  }
  if ((lower->field_0).f32[3] <= (value->field_0).f32[3]) {
    local_40 = (value->field_0).f32[3];
  }
  else {
    local_40 = (lower->field_0).f32[3];
  }
  if (local_34 < (upper->field_0).f32[0] || local_34 == (upper->field_0).f32[0]) {
    local_44 = local_34;
  }
  else {
    local_44 = (float)(upper->field_0).i32[0];
  }
  if (local_38 < (upper->field_0).f32[1] || local_38 == (upper->field_0).f32[1]) {
    local_48 = local_38;
  }
  else {
    local_48 = (float)(upper->field_0).i32[1];
  }
  if (local_3c < (upper->field_0).f32[2] || local_3c == (upper->field_0).f32[2]) {
    local_4c = local_3c;
  }
  else {
    local_4c = (float)(upper->field_0).i32[2];
  }
  if (local_40 < (upper->field_0).f32[3] || local_40 == (upper->field_0).f32[3]) {
    local_50 = local_40;
  }
  else {
    local_50 = (float)(upper->field_0).i32[3];
  }
  aVar1.i32[1] = (Type)local_48;
  aVar1.i32[0] = (Type)local_44;
  aVar1.i32[2] = (Type)local_4c;
  aVar1.i32[3] = (Type)local_50;
  return (SIMDValue)aVar1;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpClamp(const SIMDValue& value, const SIMDValue& lower, const SIMDValue& upper)
    { // SIMD review: do we have intrinsic for the implementation?
        SIMDValue result;

        // lower clamp
        result.f32[SIMD_X] = value.f32[SIMD_X] < lower.f32[SIMD_X] ? lower.f32[SIMD_X] : value.f32[SIMD_X];
        result.f32[SIMD_Y] = value.f32[SIMD_Y] < lower.f32[SIMD_Y] ? lower.f32[SIMD_Y] : value.f32[SIMD_Y];
        result.f32[SIMD_Z] = value.f32[SIMD_Z] < lower.f32[SIMD_Z] ? lower.f32[SIMD_Z] : value.f32[SIMD_Z];
        result.f32[SIMD_W] = value.f32[SIMD_W] < lower.f32[SIMD_W] ? lower.f32[SIMD_W] : value.f32[SIMD_W];

        // upper clamp
        result.f32[SIMD_X] = result.f32[SIMD_X] > upper.f32[SIMD_X] ? upper.f32[SIMD_X] : result.f32[SIMD_X];
        result.f32[SIMD_Y] = result.f32[SIMD_Y] > upper.f32[SIMD_Y] ? upper.f32[SIMD_Y] : result.f32[SIMD_Y];
        result.f32[SIMD_Z] = result.f32[SIMD_Z] > upper.f32[SIMD_Z] ? upper.f32[SIMD_Z] : result.f32[SIMD_Z];
        result.f32[SIMD_W] = result.f32[SIMD_W] > upper.f32[SIMD_W] ? upper.f32[SIMD_W] : result.f32[SIMD_W];

        return result;
    }